

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O1

fsg_model_t *
jsgf_build_fsg_internal
          (jsgf_t *grammar,jsgf_rule_t *rule,logmath_t *lmath,float32 lw,int do_closure)

{
  int32 from;
  long *plVar1;
  undefined8 *puVar2;
  long lVar3;
  int iVar4;
  int logp;
  fsg_model_t *fsg;
  gnode_s *pgVar5;
  glist_t pgVar6;
  int32 iVar7;
  
  if (rule == (jsgf_rule_t *)0x0 || grammar == (jsgf_t *)0x0) {
    fsg = (fsg_model_t *)0x0;
  }
  else {
    for (pgVar6 = grammar->links; pgVar6 != (glist_t)0x0; pgVar6 = pgVar6->next) {
      ckd_free((pgVar6->data).ptr);
    }
    glist_free(grammar->links);
    grammar->links = (glist_t)0x0;
    rule->entry = 0;
    rule->exit = 0;
    grammar->nstate = 0;
    expand_rule(grammar,rule);
    fsg = fsg_model_init(rule->name,lmath,lw,grammar->nstate);
    fsg->start_state = rule->entry;
    fsg->final_state = rule->exit;
    pgVar5 = glist_reverse(grammar->links);
    grammar->links = pgVar5;
    for (; pgVar5 != (glist_t)0x0; pgVar5 = pgVar5->next) {
      plVar1 = (long *)(pgVar5->data).ptr;
      puVar2 = (undefined8 *)*plVar1;
      if (puVar2 == (undefined8 *)0x0) {
        from = (int32)plVar1[1];
        iVar7 = *(int32 *)((long)plVar1 + 0xc);
        iVar4 = 0;
LAB_0012f910:
        fsg_model_null_trans_add(fsg,from,iVar7,iVar4);
      }
      else {
        if (*(char *)*puVar2 == '<') {
          from = (int32)plVar1[1];
          iVar7 = *(int32 *)((long)plVar1 + 0xc);
          iVar4 = logmath_log(lmath,(float64)(double)*(float *)(puVar2 + 2));
          goto LAB_0012f910;
        }
        iVar4 = fsg_model_word_add(fsg,(char *)*puVar2);
        lVar3 = plVar1[1];
        iVar7 = *(int32 *)((long)plVar1 + 0xc);
        logp = logmath_log(lmath,(float64)(double)*(float *)(*plVar1 + 0x10));
        fsg_model_trans_add(fsg,(int32)lVar3,iVar7,logp,iVar4);
      }
    }
    if (do_closure != 0) {
      pgVar6 = fsg_model_null_trans_closure(fsg,(glist_t)0x0);
      glist_free(pgVar6);
    }
  }
  return fsg;
}

Assistant:

static fsg_model_t *
jsgf_build_fsg_internal(jsgf_t * grammar, jsgf_rule_t * rule,
                        logmath_t * lmath, float32 lw, int do_closure)
{
    fsg_model_t *fsg;
    glist_t nulls;
    gnode_t *gn;
    
    if (grammar == NULL || rule == NULL)
	return NULL;

    /* Clear previous links */
    for (gn = grammar->links; gn; gn = gnode_next(gn)) {
        ckd_free(gnode_ptr(gn));
    }
    glist_free(grammar->links);
    grammar->links = NULL;
    rule->entry = rule->exit = 0;
    grammar->nstate = 0;
    expand_rule(grammar, rule);

    fsg = fsg_model_init(rule->name, lmath, lw, grammar->nstate);
    fsg->start_state = rule->entry;
    fsg->final_state = rule->exit;
    grammar->links = glist_reverse(grammar->links);
    for (gn = grammar->links; gn; gn = gnode_next(gn)) {
        jsgf_link_t *link = gnode_ptr(gn);

        if (link->atom) {
            if (jsgf_atom_is_rule(link->atom)) {
                fsg_model_null_trans_add(fsg, link->from, link->to,
                                         logmath_log(lmath,
                                                     link->atom->weight));
            }
            else {
                int wid = fsg_model_word_add(fsg, link->atom->name);
                fsg_model_trans_add(fsg, link->from, link->to,
                                    logmath_log(lmath, link->atom->weight),
                                    wid);
            }
        }
        else {
            fsg_model_null_trans_add(fsg, link->from, link->to, 0);
        }
    }
    if (do_closure) {
        nulls = fsg_model_null_trans_closure(fsg, NULL);
        glist_free(nulls);
    }

    return fsg;
}